

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O3

LLVMValueRef CompileLlvmBreak(LlvmCompilationContext *ctx,ExprBreak *node)

{
  uint uVar1;
  
  if (node->closures != (ExprBase *)0x0) {
    CompileLlvm(ctx,node->closures);
  }
  uVar1 = (ctx->loopInfo).count;
  if (uVar1 - *(int *)&(node->super_ExprBase).field_0x2c < uVar1) {
    if ((node->super_ExprBase).type == ctx->ctx->typeVoid) {
      return (LLVMValueRef)0x0;
    }
    __assert_fail("node->type == ctx.ctx.typeVoid",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                  ,0x27b,
                  "LLVMValueRef CheckType(LlvmCompilationContext &, ExprBase *, LLVMValueRef)");
  }
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x199,
                "T &SmallArray<LlvmCompilationContext::LoopInfo, 32>::operator[](unsigned int) [T = LlvmCompilationContext::LoopInfo, N = 32]"
               );
}

Assistant:

LLVMValueRef CompileLlvmBreak(LlvmCompilationContext &ctx, ExprBreak *node)
{
	if(node->closures)
		CompileLlvm(ctx, node->closures);

	LLVMBasicBlockRef target = ctx.loopInfo[ctx.loopInfo.size() - node->depth].breakBlock;

	LLVMBuildBr(ctx.builder, target);

	LLVMBasicBlockRef afterReturn = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "after_break");

	LLVMPositionBuilderAtEnd(ctx.builder, afterReturn);

	return CheckType(ctx, node, NULL);
}